

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O2

void __thiscall QNetworkReplyImplPrivate::_q_bufferOutgoingData(QNetworkReplyImplPrivate *this)

{
  char *pcVar1;
  element_type *peVar2;
  longlong lVar3;
  long lVar4;
  long in_FS_OFFSET;
  Connection CStack_48;
  QObject local_40 [8];
  __shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->outgoingDataBuffer).super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    pcVar1 = *(char **)&(this->super_QNetworkReplyPrivate).field_0x8;
    std::make_shared<QRingBuffer>();
    std::__shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->outgoingDataBuffer).
                super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>,&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    QObject::connect(local_40,(char *)this->outgoingData,(QObject *)"2readyRead()",pcVar1,0x240a90);
    QMetaObject::Connection::~Connection((Connection *)local_40);
    QObject::connect((QObject *)&CStack_48,(char *)this->outgoingData,
                     (QObject *)"2readChannelFinished()",pcVar1,0x240ac0);
    QMetaObject::Connection::~Connection(&CStack_48);
  }
  do {
    (**(code **)(*(long *)this->outgoingData + 0xa0))();
    lVar3 = QRingBuffer::reserve
                      ((longlong)
                       (this->outgoingDataBuffer).
                       super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    lVar4 = QIODevice::read((char *)this->outgoingData,lVar3);
    peVar2 = (this->outgoingDataBuffer).super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (lVar4 == 0) {
      QRingBuffer::chop((longlong)peVar2);
LAB_0018fd43:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return;
      }
      __stack_chk_fail();
    }
    if (lVar4 == -1) {
      QRingBuffer::chop((longlong)peVar2);
      _q_bufferOutgoingDataFinished(this);
      goto LAB_0018fd43;
    }
    QRingBuffer::chop((longlong)peVar2);
  } while( true );
}

Assistant:

void QNetworkReplyImplPrivate::_q_bufferOutgoingData()
{
    Q_Q(QNetworkReplyImpl);

    if (!outgoingDataBuffer) {
        // first call, create our buffer
        outgoingDataBuffer = std::make_shared<QRingBuffer>();

        QObject::connect(outgoingData, SIGNAL(readyRead()), q, SLOT(_q_bufferOutgoingData()));
        QObject::connect(outgoingData, SIGNAL(readChannelFinished()), q, SLOT(_q_bufferOutgoingDataFinished()));
    }

    qint64 bytesBuffered = 0;
    qint64 bytesToBuffer = 0;

    // read data into our buffer
    forever {
        bytesToBuffer = outgoingData->bytesAvailable();
        // unknown? just try 2 kB, this also ensures we always try to read the EOF
        if (bytesToBuffer <= 0)
            bytesToBuffer = 2*1024;

        char *dst = outgoingDataBuffer->reserve(bytesToBuffer);
        bytesBuffered = outgoingData->read(dst, bytesToBuffer);

        if (bytesBuffered == -1) {
            // EOF has been reached.
            outgoingDataBuffer->chop(bytesToBuffer);

            _q_bufferOutgoingDataFinished();
            break;
        } else if (bytesBuffered == 0) {
            // nothing read right now, just wait until we get called again
            outgoingDataBuffer->chop(bytesToBuffer);

            break;
        } else {
            // don't break, try to read() again
            outgoingDataBuffer->chop(bytesToBuffer - bytesBuffered);
        }
    }